

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.h
# Opt level: O3

type * __thiscall
rest_rpc::rpc_service::router::
call_helper<std::__cxx11::string(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,person_const&),0ul,person>
          (type *__return_storage_ptr__,router *this,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_weak_ptr<rest_rpc::rpc_service::connection>_person_ptr
          **f,index_sequence<0UL> *param_2,tuple<person> *tup,
          weak_ptr<rest_rpc::rpc_service::connection> *ptr)

{
  int *piVar1;
  __buckets_ptr pp_Var2;
  int iVar3;
  undefined8 local_18;
  long *local_10;
  
  pp_Var2 = (this->map_invokers_)._M_h._M_buckets;
  local_18 = *(undefined8 *)
              &(tup->super__Tuple_impl<0UL,_person>).super__Head_base<0UL,_person,_false>.
               _M_head_impl;
  local_10 = (long *)(tup->super__Tuple_impl<0UL,_person>).super__Head_base<0UL,_person,_false>.
                     _M_head_impl.name._M_dataplus._M_p;
  if (local_10 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)((long)local_10 + 0xc) = *(int *)((long)local_10 + 0xc) + 1;
      UNLOCK();
    }
    else {
      *(int *)((long)local_10 + 0xc) = *(int *)((long)local_10 + 0xc) + 1;
    }
  }
  (*(code *)pp_Var2)(__return_storage_ptr__,&local_18,param_2);
  if (local_10 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)((long)local_10 + 0xc);
      iVar3 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = *(int *)((long)local_10 + 0xc);
      *(int *)((long)local_10 + 0xc) = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (**(code **)(*local_10 + 0x18))();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static typename std::result_of<F(std::weak_ptr<connection>, Args...)>::type
  call_helper(const F &f, const nonstd::index_sequence<I...> &,
              std::tuple<Args...> tup, std::weak_ptr<connection> ptr) {
    return f(ptr, std::move(std::get<I>(tup))...);
  }